

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptNativeIntArray::GetItemQuery
          (JavascriptNativeIntArray *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  undefined8 in_RAX;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  uint local_24 [2];
  int32 intvalue;
  
  local_24[0] = (uint)((ulong)in_RAX >> 0x20);
  bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  if (bVar1) {
    this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  }
  else {
    this_00 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
  }
  if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
  }
  BVar2 = JavascriptArray::DirectGetItemAt<int>((JavascriptArray *)this,index,(int *)local_24);
  if (BVar2 != 0) {
    *value = (Var)((ulong)local_24[0] | 0x1000000000000);
  }
  return (PropertyQueryFlags)(BVar2 != 0);
}

Assistant:

PropertyQueryFlags JavascriptNativeIntArray::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        return JavascriptConversion::BooleanToPropertyQueryFlags(JavascriptNativeIntArray::DirectGetVarItemAt(index, value, requestContext));
    }